

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O1

uint parse_format(char *format,char *pformatList,uint maxFormats)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  if (maxFormats == 0) {
    uVar6 = 0;
  }
  else {
    uVar10 = 0;
    uVar7 = 0;
    do {
      while( true ) {
        uVar6 = (uint)uVar7;
        if (format[uVar10] != '%') {
          if (format[uVar10] == '\0') {
            return uVar6;
          }
          goto LAB_00110ed3;
        }
        uVar5 = (ulong)(byte)format[uVar10 + 1];
        uVar4 = uVar10 + 1;
        uVar8 = (uint)uVar4;
        if (uVar5 < 0x31) break;
LAB_00110d8b:
        uVar8 = (uint)uVar4;
        do {
          uVar8 = uVar8 + 1;
          uVar3 = (uint)uVar4;
          uVar5 = uVar4 & 0xffffffff;
          uVar4 = (ulong)(uVar3 + 1);
        } while ((byte)(format[uVar5] - 0x30U) < 10);
        if (format[uVar5] == '.') {
          do {
            uVar3 = uVar8;
            uVar8 = uVar3 + 1;
          } while ((byte)(format[uVar3] - 0x30U) < 10);
        }
        bVar2 = format[uVar3];
        if (bVar2 < 0x6c) {
          if (bVar2 != 0x4c) {
            if (bVar2 != 0x68) {
              if (bVar2 == 0x6a) goto LAB_00110df2;
              goto LAB_00110df6;
            }
            uVar4 = (ulong)(uVar3 + 1);
            if (format[uVar4] == 'h') {
              uVar3 = uVar3 + 2;
              bVar12 = true;
              bVar11 = false;
              goto LAB_00110e4e;
            }
            bVar2 = 1;
            bVar12 = false;
            bVar11 = false;
            goto LAB_00110e50;
          }
          bVar9 = 1;
          bVar12 = false;
          uVar4 = (ulong)uVar3;
          bVar11 = false;
          bVar2 = 0;
        }
        else {
          if (bVar2 == 0x6c) {
            uVar8 = uVar3 + 1;
            bVar11 = format[uVar8] != 'l';
            uVar3 = uVar3 + 2;
            if (bVar11) {
              uVar3 = uVar8;
            }
            bVar12 = false;
          }
          else {
            if ((bVar2 == 0x74) || (bVar2 == 0x7a)) {
LAB_00110df2:
              uVar3 = uVar3 + 1;
            }
LAB_00110df6:
            bVar12 = false;
            bVar11 = false;
          }
LAB_00110e4e:
          uVar4 = (ulong)uVar3;
          bVar2 = 0;
LAB_00110e50:
          bVar9 = 0;
        }
        uVar8 = (uint)uVar4;
        bVar1 = format[uVar4];
        switch(bVar1) {
        case 0x58:
        case 100:
        case 0x69:
        case 0x6f:
        case 0x75:
        case 0x78:
          bVar2 = bVar2 * '\x04' + 100;
          if (bVar11 != false) {
            bVar2 = 0x6c;
          }
          bVar12 = !bVar12;
          bVar9 = 99;
          goto LAB_00110ea6;
        case 0x59:
        case 0x5a:
        case 0x5b:
        case 0x5c:
        case 0x5d:
        case 0x5e:
        case 0x5f:
        case 0x60:
        case 0x62:
        case 0x68:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x76:
        case 0x77:
          goto switchD_00110e73_caseD_59;
        case 0x61:
        case 0x65:
        case 0x66:
        case 0x67:
switchD_00110e73_caseD_61:
          pformatList[uVar7] = (bVar9 ^ 1) << 5 | 0x47;
          break;
        case 99:
          pformatList[uVar7] = (bVar11 ^ 1U) << 5 | 0x43;
          break;
        case 0x6d:
          uVar8 = uVar8 + 1;
          goto LAB_00110e79;
        case 0x6e:
          bVar2 = bVar2 ^ 0x33;
          if (bVar11 != false) {
            bVar2 = 0x34;
          }
          bVar12 = !bVar12;
          bVar9 = 0x31;
          goto LAB_00110ea6;
        case 0x70:
          pformatList[uVar7] = 'p';
          break;
        case 0x73:
          bVar2 = (bVar9 ^ 1) << 5 | 0x53;
          bVar12 = bVar11 == false;
          bVar9 = 0x53;
LAB_00110ea6:
          if (!bVar12) {
            bVar2 = bVar9;
          }
          pformatList[uVar7] = bVar2;
          break;
        default:
          if ((bVar1 - 0x45 < 3) || (bVar1 == 0x41)) goto switchD_00110e73_caseD_61;
          goto switchD_00110e73_caseD_59;
        }
        uVar7 = (ulong)(uVar6 + 1);
        uVar10 = (ulong)(uVar8 + 1);
LAB_00110ed3:
        uVar6 = (uint)uVar7;
        uVar8 = (uint)(format[uVar10] != '%') + (int)uVar10;
        uVar10 = (ulong)uVar8;
        if (0xfff < uVar8) {
          return uVar6;
        }
        if (maxFormats <= uVar6) {
          return uVar6;
        }
      }
      if ((0x1280900000000U >> (uVar5 & 0x3f) & 1) != 0) {
        uVar4 = (ulong)((uint)uVar10 + 2);
        goto LAB_00110d8b;
      }
      if ((0x2000000001U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00110d8b;
LAB_00110e79:
      uVar10 = (ulong)uVar8;
    } while (uVar8 < 0x1000);
  }
  return uVar6;
switchD_00110e73_caseD_59:
  __printf_chk(1,"failed to recognize format string [");
  if ((uint)uVar10 < uVar8) {
    do {
      __printf_chk(1,"%c",(int)format[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  puts("]");
  uVar10 = uVar4;
  goto LAB_00110ed3;
}

Assistant:

unsigned int
parse_format(const char *format, char pformatList[], unsigned int maxFormats)
{
	unsigned int  numFormats = 0;
	unsigned int  index = 0;
	unsigned int  start = 0;
	char		  lmod = 0;

	while (index < RSIZE_MAX_STR && format[index] != '\0' && numFormats < maxFormats)
	{
		if (format[index] == '%') {
			start = index; // remember where the format string started
			// Check for flags
			switch( format[++index]) {
			case '\0': continue; // skip - end of format string
			case '%' : continue; // skip - actually a percent character
			case '#' : // convert to alternate form
			case '0' : // zero pad
			case '-' : // left adjust
			case ' ' : // pad with spaces
			case '+' : // force a sign be used
				index++; // skip the flag character
				break;
			}
			// check for and skip the optional field width
			while ( format[index] != '\0' && format[index] >= '0' && format[index] <= '9') {
				index++;
			}
			// Check for an skip the optional precision
			if ( format[index] != '\0' && format[index] == '.') {
				index++; // skip the period
				while ( format[index] != '\0' && format[index] >= '0' && format[index] <= '9') {
					index++;
				}
			}
			// Check for and skip the optional length modifiers
			lmod = ' ';
			switch( format[index]) {
			case 'h' : if ( format[++index] == 'h') {
				           ++index; //also recognize the 'hh' modifier
				           lmod = 'H'; // for char
			           } else {
			               lmod = 'h'; // for short
			           }
					   break;
			case 'l' : if ( format[++index] == 'l') {
				           ++index; //also recognize the 'll' modifier
				           lmod = 'd'; // for long long
			           } else {
			               lmod = 'l'; // for long
			           }
			           break;
			case 'L' : lmod = 'L'; break;
			case 'j' :
			case 'z' :
			case 't' : index++;
			           break;
			}

			// Recognize and record the actual modifier
			switch( format[index]) {
			case 'c' :
				 if ( lmod == 'l') {
					 pformatList[numFormats] = FMT_WCHAR; // store the format character
				 } else {
					 pformatList[numFormats] = FMT_CHAR;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'd' : case 'i' : // signed
			case 'o' : case 'u' : // unsigned
			case 'x' : case 'X' : // unsigned
				 if ( lmod == 'H') {
					 pformatList[numFormats] = FMT_CHAR; // store the format character
				 } else if ( lmod == 'l') {
				 	 pformatList[numFormats] = FMT_LONG; // store the format character
				 } else if ( lmod == 'h') {
					 pformatList[numFormats] = FMT_SHORT; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_INT;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'e' : case 'E' :
			case 'f' : case 'F' :
			case 'g' : case 'G' :
			case 'a' : case 'A' :
				 if ( lmod == 'L') {
					 pformatList[numFormats] = FMT_LDOUBLE; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_DOUBLE;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 's' :
				 if ( lmod == 'l' || lmod == 'L') {
					 pformatList[numFormats] = FMT_WSTRING; // store the format character
				 } else {
					 pformatList[numFormats] = FMT_STRING;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'p' :
				 pformatList[numFormats] = FMT_VOID;
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'n' :
				 if ( lmod == 'H') {
					 pformatList[numFormats] = FMT_PCHAR; // store the format character
				 } else if ( lmod == 'l') {
					 pformatList[numFormats] = FMT_PLONG; // store the format character
				 } else if ( lmod == 'h') {
					 pformatList[numFormats] = FMT_PSHORT; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_PINT;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;
			case 'm' :
			     // Does not represent an argument in the call stack
			     index++; // skip the format character
			     continue;
			default:
				printf("failed to recognize format string [");
				for (;start<index; start++) { printf("%c", format[start]); }
				puts("]");
				break;
			}
		}
        if (format[index] != '%')
            // don't know why it skips over blindly, not handling cases such as "%s%d".
            index++; // move past this character
	}

	return numFormats;
}